

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::mouseReleaseEvent(QMenu *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  QMenuPrivate *this_00;
  QPoint this_01;
  QMenuPrivate *this_02;
  QMenu *pQVar3;
  ulong uVar4;
  QPoint in_RDI;
  long in_FS_OFFSET;
  QPointF QVar5;
  QAction *action;
  QMenuPrivate *d;
  QMouseEvent *in_stack_00000060;
  QMenuPrivate *in_stack_00000068;
  QMenuPrivate *in_stack_ffffffffffffffb0;
  QPoint p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  this_00 = d_func((QMenu *)0x64af8f);
  if (((*(ushort *)&this_00->field_0x420 >> 8 & 1) == 0) &&
     (bVar2 = QMenuPrivate::mouseEventTaken(in_stack_00000068,in_stack_00000060), !bVar2)) {
    if ((QPoint)QMenuPrivate::mouseDown == in_RDI) {
      QMenuPrivate::mouseDown = (QMenu *)0x0;
      QMenuPrivate::setSyncAction(in_stack_ffffffffffffffb0);
      QSinglePointEvent::globalPosition((QSinglePointEvent *)0x64b00f);
      QPointF::toPoint((QPointF *)in_RDI);
      bVar2 = QMenuPrivate::hasMouseMoved(this_00,(QPoint *)in_stack_ffffffffffffffb0);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        QVar5 = QSinglePointEvent::position((QSinglePointEvent *)0x64b064);
        this_01 = QPointF::toPoint((QPointF *)in_RDI);
        this_02 = (QMenuPrivate *)QMenuPrivate::actionAt((QMenuPrivate *)this_01,p);
        if ((this_02 == (QMenuPrivate *)0x0) || (this_02 != (QMenuPrivate *)this_00->currentAction))
        {
          if ((this_02 == (QMenuPrivate *)0x0) || (uVar4 = QAction::isEnabled(), (uVar4 & 1) != 0))
          {
            QMenuPrivate::hideUpToMenuBar(this_02);
          }
        }
        else {
          pQVar3 = QAction::menu<QMenu*>((QAction *)0x64b0b8);
          if (pQVar3 == (QMenu *)0x0) {
            QMenuPrivate::activateAction
                      ((QMenuPrivate *)QVar5.yp,(QAction *)QVar5.xp,p.yp.m_i.m_i,p.xp.m_i._3_1_);
          }
        }
      }
      else {
        QMenuPrivate::hideUpToMenuBar(in_stack_ffffffffffffffb0);
      }
    }
    else {
      QMenuPrivate::mouseDown = (QMenu *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QMenu);
    if (d->aboutToHide || d->mouseEventTaken(e))
        return;
    if (QMenuPrivate::mouseDown != this) {
        QMenuPrivate::mouseDown = nullptr;
        return;
    }

    QMenuPrivate::mouseDown = nullptr;
    d->setSyncAction();

    if (!d->hasMouseMoved(e->globalPosition().toPoint())) {
        // We don't want to trigger a menu item if the mouse hasn't moved
        // since the popup was opened. Instead we want to close the menu.
        d->hideUpToMenuBar();
        return;
    }

    QAction *action = d->actionAt(e->position().toPoint());
    if (action && action == d->currentAction) {
        if (!action->menu()) {
#if defined(Q_OS_WIN)
            //On Windows only context menus can be activated with the right button
            if (e->button() == Qt::LeftButton || d->topCausedWidget() == 0)
#endif
                d->activateAction(action, QAction::Trigger);
        }
    } else if (!action || action->isEnabled()) {
        d->hideUpToMenuBar();
    }
}